

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Liby::Socket::Socket(Socket *this,bool isUdp_)

{
  this->isUdp_ = isUdp_;
  this->fd_ = -1;
  (this->ep_).addr_ = 0;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ep_).port_ = 0;
  createSocket(this);
  return;
}

Assistant:

Socket::Socket(bool isUdp_) : isUdp_(isUdp_) { createSocket(); }